

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::update(ClingoView *this,Statistics *stats)

{
  bool bVar1;
  uint32 uVar2;
  ulong uVar3;
  StatsMap *pSVar4;
  StatsMap *pSVar5;
  void *obj;
  StatisticObject local_30;
  
  if ((stats->level_ != 0) &&
     (obj = (void *)((this->accu_).ptr_ & 0xfffffffffffffffe), obj != (void *)0x0)) {
    pSVar5 = this->keys_;
    uVar2 = StatisticObject::registerMap<Clasp::StatsMap>();
    StatisticObject::StatisticObject(&local_30,obj,uVar2);
    bVar1 = StatsMap::add(pSVar5,"accu",&local_30);
    if (bVar1) {
      pSVar5 = (StatsMap *)((this->accu_).ptr_ & 0xfffffffffffffffe);
      StepStats::addTo((StepStats *)(pSVar5 + 1),pSVar5);
      pSVar5 = (StatsMap *)((this->accu_).ptr_ & 0xfffffffffffffffe);
      uVar2 = StatisticObject::registerMap<Clasp::StatsMap>();
      StatisticObject::StatisticObject(&local_30,pSVar5 + 3,uVar2);
      StatsMap::add(pSVar5,"solving",&local_30);
    }
  }
  uVar3 = (this->accu_).ptr_ & 0xfffffffffffffffe;
  pSVar5 = (StatsMap *)(uVar3 + 0x30);
  if (uVar3 == 0) {
    pSVar5 = (StatsMap *)0x0;
  }
  pSVar4 = (StatsMap *)0x0;
  if (stats->level_ != 0) {
    pSVar4 = pSVar5;
  }
  addTo(stats,&this->solving_,pSVar4);
  if (stats->tester_ != (NonHcfStats *)0x0) {
    uVar3 = (this->accu_).ptr_ & 0xfffffffffffffffe;
    pSVar5 = (StatsMap *)(uVar3 + 0x30);
    if (uVar3 == 0) {
      pSVar5 = (StatsMap *)0x0;
    }
    pSVar4 = (StatsMap *)0x0;
    if (stats->level_ != 0) {
      pSVar4 = pSVar5;
    }
    Asp::PrgDepGraph::NonHcfStats::addTo(stats->tester_,&this->problem_,&this->solving_,pSVar4);
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::ClingoView::update(const ClaspFacade::Statistics& stats) {
	if (stats.level_ > 0 && accu_.get() && keys_->add("accu", accu_->toStats())) {
		accu_->step.addTo(*accu_);
		accu_->add("solving", accu_->solving_.toStats());
	}
	stats.addTo(solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	if (stats.tester_) {
		stats.tester_->addTo(problem_, solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	}
}